

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O0

void __thiscall five_point_solver::advance_b(five_point_solver *this)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  celle ***pppcVar14;
  cellb ***pppcVar15;
  long in_RDI;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  int k_3;
  int j_3;
  int i_3;
  int k_2;
  int j_2;
  int i_2;
  int k_1;
  int j_1;
  int i_1;
  int k;
  int j;
  int i;
  int nz;
  int ny;
  int nx;
  int in_stack_fffffffffffff97c;
  field3d<cellb> *in_stack_fffffffffffff980;
  int local_40;
  int local_3c;
  int local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  int local_18;
  
  iVar10 = field3d<cellb>::get_nx(*(field3d<cellb> **)(in_RDI + 0x10));
  iVar11 = field3d<cellb>::get_ny(*(field3d<cellb> **)(in_RDI + 0x10));
  iVar12 = field3d<cellb>::get_nz(*(field3d<cellb> **)(in_RDI + 0x10));
  for (local_18 = 1; local_18 < iVar10 + -2; local_18 = local_18 + 1) {
    for (local_1c = 1; local_1c < iVar11 + -2; local_1c = local_1c + 1) {
      for (local_20 = 1; local_20 < iVar12 + -2; local_20 = local_20 + 1) {
        uVar1 = *(ulong *)(in_RDI + 0x40);
        uVar2 = *(ulong *)(in_RDI + 0x70);
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar3 = (*pppcVar14)[local_1c + 1][local_20].ez;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar4 = (*pppcVar14)[local_1c][local_20].ez;
        dVar5 = *(double *)(in_RDI + 0x58);
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar6 = (*pppcVar14)[local_1c + 2][local_20].ez;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar7 = (*pppcVar14)[local_1c + 1][local_20].ez;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar8 = (*pppcVar14)[local_1c][local_20].ez;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar3 - dVar4;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar2;
        auVar76._8_8_ = 0;
        auVar76._0_8_ =
             dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[local_1c + -1][local_20].ez);
        auVar34 = vfmadd213sd_fma(auVar16,auVar40,auVar76);
        auVar17._0_8_ = auVar34._0_8_;
        dVar3 = *(double *)(in_RDI + 0x48);
        uVar2 = *(ulong *)(in_RDI + 0x78);
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar4 = (*pppcVar14)[local_1c][local_20 + 1].ey;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar5 = (*pppcVar14)[local_1c][local_20].ey;
        dVar6 = *(double *)(in_RDI + 0x60);
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar7 = (*pppcVar14)[local_1c][local_20 + 2].ey;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar8 = (*pppcVar14)[local_1c][local_20 + 1].ey;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar9 = (*pppcVar14)[local_1c][local_20].ey;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        auVar112._8_8_ = 0;
        auVar112._0_8_ = dVar4 - dVar5;
        auVar124._8_8_ = 0;
        auVar124._0_8_ = uVar2;
        auVar17._8_8_ = 0;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar1 ^ 0x8000000000000000;
        auVar136._8_8_ = 0;
        auVar136._0_8_ =
             dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[local_1c][local_20 + -1].ey);
        auVar34 = vfmadd213sd_fma(auVar112,auVar124,auVar136);
        auVar77._8_8_ = 0;
        auVar77._0_8_ = dVar3 * auVar34._0_8_;
        auVar34 = vfmadd213sd_fma(auVar17,auVar41,auVar77);
        pppcVar15 = field3d<cellb>::operator[](in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = auVar34._0_8_;
        auVar78._8_8_ = 0;
        auVar78._0_8_ = (*pppcVar15)[local_1c][local_20].bx;
        auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar42,auVar78);
        (*pppcVar15)[local_1c][local_20].bx = auVar34._0_8_;
        uVar1 = *(ulong *)(in_RDI + 0x38);
        uVar2 = *(ulong *)(in_RDI + 0x68);
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar3 = (*pppcVar14)[local_1c][local_20].ez;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar4 = (*pppcVar14)[local_1c][local_20].ez;
        dVar5 = *(double *)(in_RDI + 0x50);
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar6 = (*pppcVar14)[local_1c][local_20].ez;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar7 = (*pppcVar14)[local_1c][local_20].ez;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar8 = (*pppcVar14)[local_1c][local_20].ez;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar3 - dVar4;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = uVar2;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[local_1c][local_20].ez);
        auVar34 = vfmadd213sd_fma(auVar18,auVar43,auVar79);
        auVar19._0_8_ = auVar34._0_8_;
        dVar3 = *(double *)(in_RDI + 0x48);
        uVar2 = *(ulong *)(in_RDI + 0x78);
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar4 = (*pppcVar14)[local_1c][local_20 + 1].ex;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar5 = (*pppcVar14)[local_1c][local_20].ex;
        dVar6 = *(double *)(in_RDI + 0x60);
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar7 = (*pppcVar14)[local_1c][local_20 + 2].ex;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar8 = (*pppcVar14)[local_1c][local_20 + 1].ex;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar9 = (*pppcVar14)[local_1c][local_20].ex;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        auVar113._8_8_ = 0;
        auVar113._0_8_ = dVar4 - dVar5;
        auVar125._8_8_ = 0;
        auVar125._0_8_ = uVar2;
        auVar19._8_8_ = 0;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = uVar1;
        auVar137._8_8_ = 0;
        auVar137._0_8_ =
             dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[local_1c][local_20 + -1].ex);
        auVar34 = vfmadd213sd_fma(auVar113,auVar125,auVar137);
        auVar80._8_8_ = 0;
        auVar80._0_8_ = -(dVar3 * auVar34._0_8_);
        auVar34 = vfmadd213sd_fma(auVar19,auVar44,auVar80);
        pppcVar15 = field3d<cellb>::operator[](in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = auVar34._0_8_;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = (*pppcVar15)[local_1c][local_20].by;
        auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar45,auVar81);
        (*pppcVar15)[local_1c][local_20].by = auVar34._0_8_;
        uVar1 = *(ulong *)(in_RDI + 0x40);
        uVar2 = *(ulong *)(in_RDI + 0x70);
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar3 = (*pppcVar14)[local_1c + 1][local_20].ex;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar4 = (*pppcVar14)[local_1c][local_20].ex;
        dVar5 = *(double *)(in_RDI + 0x58);
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar6 = (*pppcVar14)[local_1c + 2][local_20].ex;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar7 = (*pppcVar14)[local_1c + 1][local_20].ex;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar8 = (*pppcVar14)[local_1c][local_20].ex;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar3 - dVar4;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar2;
        auVar82._8_8_ = 0;
        auVar82._0_8_ =
             dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[local_1c + -1][local_20].ex);
        auVar34 = vfmadd213sd_fma(auVar20,auVar46,auVar82);
        auVar21._0_8_ = auVar34._0_8_;
        dVar3 = *(double *)(in_RDI + 0x38);
        uVar2 = *(ulong *)(in_RDI + 0x68);
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar4 = (*pppcVar14)[local_1c][local_20].ey;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar5 = (*pppcVar14)[local_1c][local_20].ey;
        dVar6 = *(double *)(in_RDI + 0x50);
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar7 = (*pppcVar14)[local_1c][local_20].ey;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar8 = (*pppcVar14)[local_1c][local_20].ey;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        dVar9 = (*pppcVar14)[local_1c][local_20].ey;
        pppcVar14 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c
                              );
        auVar114._8_8_ = 0;
        auVar114._0_8_ = dVar4 - dVar5;
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar2;
        auVar21._8_8_ = 0;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar1;
        auVar138._8_8_ = 0;
        auVar138._0_8_ = dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[local_1c][local_20].ey);
        auVar34 = vfmadd213sd_fma(auVar114,auVar126,auVar138);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = -(dVar3 * auVar34._0_8_);
        auVar34 = vfmadd213sd_fma(auVar21,auVar47,auVar83);
        pppcVar15 = field3d<cellb>::operator[](in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = auVar34._0_8_;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = (*pppcVar15)[local_1c][local_20].bz;
        auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar48,auVar84);
        (*pppcVar15)[local_1c][local_20].bz = auVar34._0_8_;
      }
    }
  }
  for (local_28 = 1; local_28 < iVar11 + -2; local_28 = local_28 + 1) {
    for (local_2c = 1; local_2c < iVar12 + -2; local_2c = local_2c + 1) {
      uVar1 = *(ulong *)(in_RDI + 0x40);
      uVar2 = *(ulong *)(in_RDI + 0x70);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar3 = (*pppcVar14)[local_28 + 1][local_2c].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[local_28][local_2c].ez;
      dVar5 = *(double *)(in_RDI + 0x58);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar6 = (*pppcVar14)[local_28 + 2][local_2c].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar7 = (*pppcVar14)[local_28 + 1][local_2c].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar8 = (*pppcVar14)[local_28][local_2c].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar3 - dVar4;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar2;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[local_28 + -1][local_2c].ez)
      ;
      auVar34 = vfmadd213sd_fma(auVar22,auVar49,auVar85);
      auVar23._0_8_ = auVar34._0_8_;
      dVar3 = *(double *)(in_RDI + 0x48);
      uVar2 = *(ulong *)(in_RDI + 0x78);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[local_28][local_2c + 1].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar5 = (*pppcVar14)[local_28][local_2c].ey;
      dVar6 = *(double *)(in_RDI + 0x60);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar7 = (*pppcVar14)[local_28][local_2c + 2].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar8 = (*pppcVar14)[local_28][local_2c + 1].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar9 = (*pppcVar14)[local_28][local_2c].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar115._8_8_ = 0;
      auVar115._0_8_ = dVar4 - dVar5;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = uVar2;
      auVar23._8_8_ = 0;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar1 ^ 0x8000000000000000;
      auVar139._8_8_ = 0;
      auVar139._0_8_ =
           dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[local_28][local_2c + -1].ey);
      auVar34 = vfmadd213sd_fma(auVar115,auVar127,auVar139);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = dVar3 * auVar34._0_8_;
      auVar34 = vfmadd213sd_fma(auVar23,auVar50,auVar86);
      pppcVar15 = field3d<cellb>::operator[](in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = auVar34._0_8_;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = (*pppcVar15)[local_28][local_2c].bx;
      auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar51,auVar87);
      (*pppcVar15)[local_28][local_2c].bx = auVar34._0_8_;
      uVar1 = *(ulong *)(in_RDI + 0x38);
      uVar2 = *(ulong *)(in_RDI + 0x68);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar3 = (*pppcVar14)[local_28][local_2c].ez;
      dVar4 = *(double *)(in_RDI + 0x50);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar5 = (*pppcVar14)[local_28][local_2c].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = -dVar3;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar2;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = dVar4 * (dVar5 - (*pppcVar14)[local_28][local_2c].ez);
      auVar34 = vfmadd213sd_fma(auVar24,auVar52,auVar88);
      auVar25._0_8_ = auVar34._0_8_;
      dVar3 = *(double *)(in_RDI + 0x48);
      uVar2 = *(ulong *)(in_RDI + 0x78);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[local_28][local_2c + 1].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar5 = (*pppcVar14)[local_28][local_2c].ex;
      dVar6 = *(double *)(in_RDI + 0x60);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar7 = (*pppcVar14)[local_28][local_2c + 2].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar8 = (*pppcVar14)[local_28][local_2c + 1].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar9 = (*pppcVar14)[local_28][local_2c].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar116._8_8_ = 0;
      auVar116._0_8_ = dVar4 - dVar5;
      auVar128._8_8_ = 0;
      auVar128._0_8_ = uVar2;
      auVar25._8_8_ = 0;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar1;
      auVar140._8_8_ = 0;
      auVar140._0_8_ =
           dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[local_28][local_2c + -1].ex);
      auVar34 = vfmadd213sd_fma(auVar116,auVar128,auVar140);
      auVar89._8_8_ = 0;
      auVar89._0_8_ = -(dVar3 * auVar34._0_8_);
      auVar34 = vfmadd213sd_fma(auVar25,auVar53,auVar89);
      pppcVar15 = field3d<cellb>::operator[](in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = auVar34._0_8_;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = (*pppcVar15)[local_28][local_2c].by;
      auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar54,auVar90);
      (*pppcVar15)[local_28][local_2c].by = auVar34._0_8_;
      uVar1 = *(ulong *)(in_RDI + 0x40);
      uVar2 = *(ulong *)(in_RDI + 0x70);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar3 = (*pppcVar14)[local_28 + 1][local_2c].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[local_28][local_2c].ex;
      dVar5 = *(double *)(in_RDI + 0x58);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar6 = (*pppcVar14)[local_28 + 2][local_2c].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar7 = (*pppcVar14)[local_28 + 1][local_2c].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar8 = (*pppcVar14)[local_28][local_2c].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar3 - dVar4;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar2;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[local_28 + -1][local_2c].ex)
      ;
      auVar34 = vfmadd213sd_fma(auVar26,auVar55,auVar91);
      auVar27._0_8_ = auVar34._0_8_;
      dVar3 = *(double *)(in_RDI + 0x38);
      uVar2 = *(ulong *)(in_RDI + 0x68);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[local_28][local_2c].ey;
      dVar5 = *(double *)(in_RDI + 0x50);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar6 = (*pppcVar14)[local_28][local_2c].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = -dVar4;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = uVar2;
      auVar27._8_8_ = 0;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar1;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = dVar5 * (dVar6 - (*pppcVar14)[local_28][local_2c].ey);
      auVar34 = vfmadd213sd_fma(auVar117,auVar129,auVar141);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = -(dVar3 * auVar34._0_8_);
      auVar34 = vfmadd213sd_fma(auVar27,auVar56,auVar92);
      pppcVar15 = field3d<cellb>::operator[](in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = auVar34._0_8_;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = (*pppcVar15)[local_28][local_2c].bz;
      auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar57,auVar93);
      (*pppcVar15)[local_28][local_2c].bz = auVar34._0_8_;
    }
  }
  for (local_30 = 1; local_30 < iVar10 + -2; local_30 = local_30 + 1) {
    iVar13 = iVar11 + -1;
    for (local_38 = 1; local_38 < iVar12 + -2; local_38 = local_38 + 1) {
      uVar1 = *(ulong *)(in_RDI + 0x40);
      uVar2 = *(ulong *)(in_RDI + 0x70);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar3 = (*pppcVar14)[iVar13][local_38].ez;
      dVar4 = *(double *)(in_RDI + 0x58);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar5 = (*pppcVar14)[iVar13][local_38].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = -dVar3;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar2;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = dVar4 * (dVar5 - (*pppcVar14)[iVar11 + -2][local_38].ez);
      auVar34 = vfmadd213sd_fma(auVar28,auVar58,auVar94);
      auVar29._0_8_ = auVar34._0_8_;
      dVar3 = *(double *)(in_RDI + 0x48);
      uVar2 = *(ulong *)(in_RDI + 0x78);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[iVar13][local_38 + 1].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar5 = (*pppcVar14)[iVar13][local_38].ey;
      dVar6 = *(double *)(in_RDI + 0x60);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar7 = (*pppcVar14)[iVar13][local_38 + 2].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar8 = (*pppcVar14)[iVar13][local_38 + 1].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar9 = (*pppcVar14)[iVar13][local_38].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar118._8_8_ = 0;
      auVar118._0_8_ = dVar4 - dVar5;
      auVar130._8_8_ = 0;
      auVar130._0_8_ = uVar2;
      auVar29._8_8_ = 0;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar1 ^ 0x8000000000000000;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[iVar13][local_38 + -1].ey);
      auVar34 = vfmadd213sd_fma(auVar118,auVar130,auVar142);
      auVar95._8_8_ = 0;
      auVar95._0_8_ = dVar3 * auVar34._0_8_;
      auVar34 = vfmadd213sd_fma(auVar29,auVar59,auVar95);
      pppcVar15 = field3d<cellb>::operator[](in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = auVar34._0_8_;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = (*pppcVar15)[iVar13][local_38].bx;
      auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar60,auVar96);
      (*pppcVar15)[iVar13][local_38].bx = auVar34._0_8_;
      uVar1 = *(ulong *)(in_RDI + 0x38);
      uVar2 = *(ulong *)(in_RDI + 0x68);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar3 = (*pppcVar14)[iVar13][local_38].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[iVar13][local_38].ez;
      dVar5 = *(double *)(in_RDI + 0x50);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar6 = (*pppcVar14)[iVar13][local_38].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar7 = (*pppcVar14)[iVar13][local_38].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar8 = (*pppcVar14)[iVar13][local_38].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar3 - dVar4;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar2;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[iVar13][local_38].ez);
      auVar34 = vfmadd213sd_fma(auVar30,auVar61,auVar97);
      auVar31._0_8_ = auVar34._0_8_;
      dVar3 = *(double *)(in_RDI + 0x48);
      uVar2 = *(ulong *)(in_RDI + 0x78);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[iVar13][local_38 + 1].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar5 = (*pppcVar14)[iVar13][local_38].ex;
      dVar6 = *(double *)(in_RDI + 0x60);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar7 = (*pppcVar14)[iVar13][local_38 + 2].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar8 = (*pppcVar14)[iVar13][local_38 + 1].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar9 = (*pppcVar14)[iVar13][local_38].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar119._8_8_ = 0;
      auVar119._0_8_ = dVar4 - dVar5;
      auVar131._8_8_ = 0;
      auVar131._0_8_ = uVar2;
      auVar31._8_8_ = 0;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar1;
      auVar143._8_8_ = 0;
      auVar143._0_8_ = dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[iVar13][local_38 + -1].ex);
      auVar34 = vfmadd213sd_fma(auVar119,auVar131,auVar143);
      auVar98._8_8_ = 0;
      auVar98._0_8_ = -(dVar3 * auVar34._0_8_);
      auVar34 = vfmadd213sd_fma(auVar31,auVar62,auVar98);
      pppcVar15 = field3d<cellb>::operator[](in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = auVar34._0_8_;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = (*pppcVar15)[iVar13][local_38].by;
      auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar63,auVar99);
      (*pppcVar15)[iVar13][local_38].by = auVar34._0_8_;
      uVar1 = *(ulong *)(in_RDI + 0x40);
      uVar2 = *(ulong *)(in_RDI + 0x70);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar3 = (*pppcVar14)[iVar13][local_38].ex;
      dVar4 = *(double *)(in_RDI + 0x58);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar5 = (*pppcVar14)[iVar13][local_38].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = -dVar3;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar2;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = dVar4 * (dVar5 - (*pppcVar14)[iVar11 + -2][local_38].ex);
      auVar34 = vfmadd213sd_fma(auVar32,auVar64,auVar100);
      auVar33._0_8_ = auVar34._0_8_;
      dVar3 = *(double *)(in_RDI + 0x38);
      uVar2 = *(ulong *)(in_RDI + 0x68);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[iVar13][local_38].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar5 = (*pppcVar14)[iVar13][local_38].ey;
      dVar6 = *(double *)(in_RDI + 0x50);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar7 = (*pppcVar14)[iVar13][local_38].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar8 = (*pppcVar14)[iVar13][local_38].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar9 = (*pppcVar14)[iVar13][local_38].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar120._8_8_ = 0;
      auVar120._0_8_ = dVar4 - dVar5;
      auVar132._8_8_ = 0;
      auVar132._0_8_ = uVar2;
      auVar33._8_8_ = 0;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar1;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[iVar13][local_38].ey);
      auVar34 = vfmadd213sd_fma(auVar120,auVar132,auVar144);
      auVar101._8_8_ = 0;
      auVar101._0_8_ = -(dVar3 * auVar34._0_8_);
      auVar34 = vfmadd213sd_fma(auVar33,auVar65,auVar101);
      pppcVar15 = field3d<cellb>::operator[](in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = auVar34._0_8_;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = (*pppcVar15)[iVar13][local_38].bz;
      auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar66,auVar102);
      (*pppcVar15)[iVar13][local_38].bz = auVar34._0_8_;
    }
  }
  for (local_3c = 1; local_3c < iVar10 + -2; local_3c = local_3c + 1) {
    for (local_40 = 1; local_40 < iVar11 + -2; local_40 = local_40 + 1) {
      iVar13 = iVar12 + -1;
      uVar1 = *(ulong *)(in_RDI + 0x40);
      uVar2 = *(ulong *)(in_RDI + 0x70);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      in_stack_fffffffffffff980 = (field3d<cellb> *)(*pppcVar14)[local_40 + 1][iVar13].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar7 = (double)in_stack_fffffffffffff980 - (*pppcVar14)[local_40][iVar13].ez;
      dVar3 = *(double *)(in_RDI + 0x58);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[local_40 + 2][iVar13].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar5 = (*pppcVar14)[local_40 + 1][iVar13].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar6 = (*pppcVar14)[local_40][iVar13].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar7;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar2;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = dVar3 * (((dVar4 - dVar5) + dVar6) - (*pppcVar14)[local_40 + -1][iVar13].ez);
      auVar34 = vfmadd213sd_fma(auVar34,auVar67,auVar103);
      auVar35._0_8_ = auVar34._0_8_;
      dVar3 = *(double *)(in_RDI + 0x48);
      uVar2 = *(ulong *)(in_RDI + 0x78);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[local_40][iVar13].ey;
      dVar5 = *(double *)(in_RDI + 0x60);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar6 = (*pppcVar14)[local_40][iVar13].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar121._8_8_ = 0;
      auVar121._0_8_ = -dVar4;
      auVar133._8_8_ = 0;
      auVar133._0_8_ = uVar2;
      auVar35._8_8_ = 0;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar1 ^ 0x8000000000000000;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = dVar5 * (dVar6 - (*pppcVar14)[local_40][iVar12 + -2].ey);
      auVar34 = vfmadd213sd_fma(auVar121,auVar133,auVar145);
      auVar104._8_8_ = 0;
      auVar104._0_8_ = dVar3 * auVar34._0_8_;
      auVar34 = vfmadd213sd_fma(auVar35,auVar68,auVar104);
      pppcVar15 = field3d<cellb>::operator[](in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = auVar34._0_8_;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = (*pppcVar15)[local_40][iVar13].bx;
      auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar69,auVar105);
      (*pppcVar15)[local_40][iVar13].bx = auVar34._0_8_;
      uVar1 = *(ulong *)(in_RDI + 0x38);
      uVar2 = *(ulong *)(in_RDI + 0x68);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar3 = (*pppcVar14)[local_40][iVar13].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[local_40][iVar13].ez;
      dVar5 = *(double *)(in_RDI + 0x50);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar6 = (*pppcVar14)[local_40][iVar13].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar7 = (*pppcVar14)[local_40][iVar13].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar8 = (*pppcVar14)[local_40][iVar13].ez;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar3 - dVar4;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar2;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[local_40][iVar13].ez);
      auVar34 = vfmadd213sd_fma(auVar36,auVar70,auVar106);
      auVar37._0_8_ = auVar34._0_8_;
      dVar3 = *(double *)(in_RDI + 0x48);
      uVar2 = *(ulong *)(in_RDI + 0x78);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[local_40][iVar13].ex;
      dVar5 = *(double *)(in_RDI + 0x60);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar6 = (*pppcVar14)[local_40][iVar13].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar122._8_8_ = 0;
      auVar122._0_8_ = -dVar4;
      auVar134._8_8_ = 0;
      auVar134._0_8_ = uVar2;
      auVar37._8_8_ = 0;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar1;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = dVar5 * (dVar6 - (*pppcVar14)[local_40][iVar12 + -2].ex);
      auVar34 = vfmadd213sd_fma(auVar122,auVar134,auVar146);
      auVar107._8_8_ = 0;
      auVar107._0_8_ = -(dVar3 * auVar34._0_8_);
      auVar34 = vfmadd213sd_fma(auVar37,auVar71,auVar107);
      pppcVar15 = field3d<cellb>::operator[](in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = auVar34._0_8_;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = (*pppcVar15)[local_40][iVar13].by;
      auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar72,auVar108);
      (*pppcVar15)[local_40][iVar13].by = auVar34._0_8_;
      uVar1 = *(ulong *)(in_RDI + 0x40);
      uVar2 = *(ulong *)(in_RDI + 0x70);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar3 = (*pppcVar14)[local_40 + 1][iVar13].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[local_40][iVar13].ex;
      dVar5 = *(double *)(in_RDI + 0x58);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar6 = (*pppcVar14)[local_40 + 2][iVar13].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar7 = (*pppcVar14)[local_40 + 1][iVar13].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar8 = (*pppcVar14)[local_40][iVar13].ex;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = dVar3 - dVar4;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = uVar2;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = dVar5 * (((dVar6 - dVar7) + dVar8) - (*pppcVar14)[local_40 + -1][iVar13].ex);
      auVar34 = vfmadd213sd_fma(auVar38,auVar73,auVar109);
      auVar39._0_8_ = auVar34._0_8_;
      dVar3 = *(double *)(in_RDI + 0x38);
      uVar2 = *(ulong *)(in_RDI + 0x68);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar4 = (*pppcVar14)[local_40][iVar13].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar5 = (*pppcVar14)[local_40][iVar13].ey;
      dVar6 = *(double *)(in_RDI + 0x50);
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar7 = (*pppcVar14)[local_40][iVar13].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar8 = (*pppcVar14)[local_40][iVar13].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      dVar9 = (*pppcVar14)[local_40][iVar13].ey;
      pppcVar14 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar123._8_8_ = 0;
      auVar123._0_8_ = dVar4 - dVar5;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = uVar2;
      auVar39._8_8_ = 0;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar1;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = dVar6 * (((dVar7 - dVar8) + dVar9) - (*pppcVar14)[local_40][iVar13].ey);
      auVar34 = vfmadd213sd_fma(auVar123,auVar135,auVar147);
      auVar110._8_8_ = 0;
      auVar110._0_8_ = -(dVar3 * auVar34._0_8_);
      auVar34 = vfmadd213sd_fma(auVar39,auVar74,auVar110);
      pppcVar15 = field3d<cellb>::operator[](in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = auVar34._0_8_;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = (*pppcVar15)[local_40][iVar13].bz;
      auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar75,auVar111);
      (*pppcVar15)[local_40][iVar13].bz = auVar34._0_8_;
    }
  }
  return;
}

Assistant:

void five_point_solver::advance_b()
{
    const int nx = cb.get_nx();
    const int ny = cb.get_ny();
    const int nz = cb.get_nz();
    // 1/2 b advance
    for(int i=1;i<nx-2;i++) {
        for(int j=1;j<ny-2;j++) {
            for(int k=1;k<nz-2;k++) {
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(ce[i][j+1][k].ez-ce[i][j][k].ez) + ay*(ce[i][j+2][k].ez-ce[i][j+1][k].ez+ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(ce[i][j][k+1].ey-ce[i][j][k].ey) + az*(ce[i][j][k+2].ey-ce[i][j][k+1].ey+ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(ce[i+1][j][k].ez-ce[i][j][k].ez) + ax*(ce[i+2][j][k].ez-ce[i+1][j][k].ez+ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(ce[i][j][k+1].ex-ce[i][j][k].ex) + az*(ce[i][j][k+2].ex-ce[i][j][k+1].ex+ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(ce[i][j+1][k].ex-ce[i][j][k].ex) + ay*(ce[i][j+2][k].ex-ce[i][j+1][k].ex+ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(ce[i+1][j][k].ey-ce[i][j][k].ey) + ax*(ce[i+2][j][k].ey-ce[i+1][j][k].ey+ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
    {int i=nx-1;
        for(int j=1;j<ny-2;j++) {
            for(int k=1;k<nz-2;k++) {
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(ce[i][j+1][k].ez-ce[i][j][k].ez) + ay*(ce[i][j+2][k].ez-ce[i][j+1][k].ez+ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(ce[i][j][k+1].ey-ce[i][j][k].ey) + az*(ce[i][j][k+2].ey-ce[i][j][k+1].ey+ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(-ce[i][j][k].ez) + ax*(ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(ce[i][j][k+1].ex-ce[i][j][k].ex) + az*(ce[i][j][k+2].ex-ce[i][j][k+1].ex+ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(ce[i][j+1][k].ex-ce[i][j][k].ex) + ay*(ce[i][j+2][k].ex-ce[i][j+1][k].ex+ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(-ce[i][j][k].ey) + ax*(ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
    for(int i=1;i<nx-2;i++) {
        {int j=ny-1;
            for(int k=1;k<nz-2;k++) {
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(-ce[i][j][k].ez) + ay*(ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(ce[i][j][k+1].ey-ce[i][j][k].ey) + az*(ce[i][j][k+2].ey-ce[i][j][k+1].ey+ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(ce[i+1][j][k].ez-ce[i][j][k].ez) + ax*(ce[i+2][j][k].ez-ce[i+1][j][k].ez+ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(ce[i][j][k+1].ex-ce[i][j][k].ex) + az*(ce[i][j][k+2].ex-ce[i][j][k+1].ex+ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(-ce[i][j][k].ex) + ay*(ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(ce[i+1][j][k].ey-ce[i][j][k].ey) + ax*(ce[i+2][j][k].ey-ce[i+1][j][k].ey+ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
    for(int i=1;i<nx-2;i++) {
        for(int j=1;j<ny-2;j++) {
            {int k=nz-1;
                cb[i][j][k].bx += 0.5*(   -dtdy*( by*(ce[i][j+1][k].ez-ce[i][j][k].ez) + ay*(ce[i][j+2][k].ez-ce[i][j+1][k].ez+ce[i][j][k].ez-ce[i][j-1][k].ez) )    +   dtdz*( bz*(-ce[i][j][k].ey) + az*(ce[i][j][k].ey-ce[i][j][k-1].ey) )  );

                cb[i][j][k].by += 0.5*(   dtdx*( bx*(ce[i+1][j][k].ez-ce[i][j][k].ez) + ax*(ce[i+2][j][k].ez-ce[i+1][j][k].ez+ce[i][j][k].ez-ce[i-1][j][k].ez) )    -   dtdz*( bz*(-ce[i][j][k].ex) + az*(ce[i][j][k].ex-ce[i][j][k-1].ex) )  );

                cb[i][j][k].bz += 0.5*(   dtdy*( by*(ce[i][j+1][k].ex-ce[i][j][k].ex) + ay*(ce[i][j+2][k].ex-ce[i][j+1][k].ex+ce[i][j][k].ex-ce[i][j-1][k].ex) )    -   dtdx*( bx*(ce[i+1][j][k].ey-ce[i][j][k].ey) + ax*(ce[i+2][j][k].ey-ce[i+1][j][k].ey+ce[i][j][k].ey-ce[i-1][j][k].ey))  );
            }
        }
    }
}